

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

int twacf(double *P,int MP,double *Q,int MQ,double *ACF,int MA,double *CVLI,int MXPQ1,double *ALPHA,
         int MXPQ)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  
  iVar2 = imax(MP,MQ);
  uVar3 = 2;
  if (iVar2 == MXPQ) {
    uVar3 = (uint)(MQ | MP) >> 0x1f;
  }
  uVar1 = MXPQ + 1;
  uVar10 = 3;
  if (uVar1 == MXPQ1) {
    uVar10 = uVar3;
  }
  uVar3 = 4;
  if (MXPQ1 <= MA) {
    uVar3 = uVar10;
  }
  if (uVar3 == 0) {
    *ACF = 1.0;
    *CVLI = 1.0;
    uVar3 = 0;
    if (MA != 1) {
      if (1 < MA) {
        memset(ACF + 1,0,(ulong)(MA - 1) << 3);
      }
      if (MXPQ1 != 1) {
        if (1 < MXPQ1) {
          memset(CVLI + 1,0,(ulong)(MXPQ1 - 1) << 3);
        }
        uVar6 = (ulong)(uint)MXPQ;
        if (0 < MXPQ) {
          memset(ALPHA,0,uVar6 * 8);
        }
        if ((MQ != 0) && (0 < MQ)) {
          uVar9 = 1;
          pdVar12 = Q;
          uVar10 = MQ;
          do {
            pdVar12 = pdVar12 + 1;
            CVLI[uVar9] = -Q[uVar9 - 1];
            dVar15 = -Q[uVar9 - 1];
            ACF[uVar9] = dVar15;
            if (uVar9 < (uint)MQ) {
              lVar11 = 0;
              do {
                dVar15 = dVar15 + Q[lVar11] * pdVar12[lVar11];
                ACF[uVar9] = dVar15;
                lVar11 = lVar11 + 1;
              } while ((ulong)uVar10 - 1 != lVar11);
            }
            *ACF = Q[uVar9 - 1] * Q[uVar9 - 1] + *ACF;
            uVar9 = uVar9 + 1;
            uVar10 = uVar10 - 1;
          } while (uVar9 != MQ + 1);
        }
        if (MP != 0) {
          if (0 < MP) {
            uVar9 = 0;
            do {
              dVar15 = P[uVar9];
              ALPHA[uVar9] = dVar15;
              CVLI[uVar9] = dVar15;
              uVar9 = uVar9 + 1;
            } while ((uint)MP != uVar9);
          }
          if (MXPQ < 1) {
            *ACF = *ACF * 0.5;
          }
          else {
            lVar11 = (long)MP;
            pdVar8 = CVLI + (uVar6 - 2);
            pdVar12 = ALPHA + (uVar6 - 1);
            uVar9 = 1;
            uVar3 = MXPQ;
            do {
              lVar13 = uVar6 - uVar9;
              if (lVar13 < lVar11) {
                dVar15 = 1.0 - ALPHA[lVar13] * ALPHA[lVar13];
                if (dVar15 <= 1e-10) {
                  return 5;
                }
                if (uVar9 == uVar6) break;
                if (0 < lVar13) {
                  lVar4 = 0;
                  pdVar7 = pdVar8;
                  do {
                    ALPHA[lVar4] = (ALPHA[lVar13] * *pdVar7 + CVLI[lVar4]) / dVar15;
                    pdVar7 = pdVar7 + -1;
                    lVar4 = lVar4 + 1;
                  } while ((ulong)uVar3 - 1 != lVar4);
                }
              }
              if (lVar13 < MQ) {
                iVar2 = imax(((int)lVar13 - MP) + 1,1);
                lVar4 = (long)iVar2;
                if (lVar4 <= lVar13) {
                  lVar5 = lVar4 + -1;
                  pdVar7 = pdVar12 + -lVar4;
                  do {
                    ACF[lVar5 + 1] = ACF[lVar13 + 1] * *pdVar7 + ACF[lVar5 + 1];
                    lVar5 = lVar5 + 1;
                    pdVar7 = pdVar7 + -1;
                  } while (lVar5 < lVar13);
                }
              }
              if (0 < lVar13 && lVar13 < lVar11) {
                lVar13 = 0;
                do {
                  CVLI[lVar13] = ALPHA[lVar13];
                  lVar13 = lVar13 + 1;
                } while ((ulong)uVar3 - 1 != lVar13);
              }
              uVar9 = uVar9 + 1;
              uVar3 = uVar3 - 1;
              pdVar8 = pdVar8 + -1;
              pdVar12 = pdVar12 + -1;
            } while (uVar9 != uVar1);
            *ACF = *ACF * 0.5;
            if (0 < MXPQ) {
              uVar6 = 1;
              lVar13 = 0x10;
              do {
                if ((long)uVar6 <= lVar11) {
                  dVar15 = ALPHA[uVar6 - 1];
                  lVar4 = 0;
                  uVar9 = uVar6;
                  do {
                    *(double *)((long)CVLI + lVar4) =
                         (ALPHA[uVar6 - 1] * ACF[uVar9] + *(double *)((long)ACF + lVar4)) /
                         (1.0 - dVar15 * dVar15);
                    lVar4 = lVar4 + 8;
                    bVar14 = uVar9 != 0;
                    uVar9 = uVar9 - 1;
                  } while (bVar14);
                  lVar4 = 0;
                  do {
                    *(undefined8 *)((long)ACF + lVar4) = *(undefined8 *)((long)CVLI + lVar4);
                    lVar4 = lVar4 + 8;
                  } while (lVar13 != lVar4);
                }
                uVar6 = uVar6 + 1;
                lVar13 = lVar13 + 8;
              } while (uVar6 != uVar1);
            }
          }
          if (0 < MA) {
            uVar6 = 1;
            pdVar12 = ACF;
            do {
              iVar2 = imin((int)uVar6 + -1,MP);
              if (0 < iVar2) {
                dVar15 = ACF[uVar6 - 1];
                lVar11 = -1;
                pdVar8 = P;
                do {
                  dVar15 = dVar15 + *pdVar8 * pdVar12[lVar11];
                  ACF[uVar6 - 1] = dVar15;
                  pdVar8 = pdVar8 + 1;
                  lVar11 = lVar11 + -1;
                } while (-lVar11 != (ulong)(iVar2 + 1));
              }
              uVar6 = uVar6 + 1;
              pdVar12 = pdVar12 + 1;
            } while (uVar6 != MA + 1);
          }
          *ACF = *ACF + *ACF;
          *CVLI = 1.0;
          uVar3 = 0;
          if (0 < MQ) {
            uVar6 = 1;
            uVar3 = 0;
            pdVar12 = CVLI;
            do {
              CVLI[uVar6] = -Q[uVar6 - 1];
              iVar2 = imin((int)uVar6,MP);
              if (0 < iVar2) {
                dVar15 = CVLI[uVar6];
                lVar11 = 0;
                pdVar8 = P;
                do {
                  dVar15 = dVar15 + *pdVar8 * pdVar12[lVar11];
                  CVLI[uVar6] = dVar15;
                  pdVar8 = pdVar8 + 1;
                  lVar11 = lVar11 + -1;
                } while (1 - (ulong)(iVar2 + 1) != lVar11);
              }
              uVar6 = uVar6 + 1;
              pdVar12 = pdVar12 + 1;
            } while (uVar6 != MQ + 1);
          }
        }
      }
    }
  }
  return uVar3;
}

Assistant:

int twacf(double *P, int MP, double *Q, int MQ, double *ACF, int MA, double *CVLI, int MXPQ1, double *ALPHA, int MXPQ) {
	int ifault, i, k, kc, j, jpk, kcp1mj, j1, kp1, kp2mj, miim1p, imj, mikp, kp1mj;
	double epsil2, zero, one, half, two, div;

	ifault = 0;
	epsil2 = 1.0e-10;
	zero = 0.0; half = 0.5, one = 1.0, two = 2.0;

	if (MP < 0 || MQ < 0) {
		ifault = 1;
	}
	if (MXPQ != imax(MP, MQ)) {
		ifault = 2;
	}
	if (MXPQ1 != MXPQ + 1) {
		ifault = 3;
	}
	if (MA < MXPQ1) {
		ifault = 4;
	}

	if (ifault > 0) {
		return ifault;
	}

	// Initialization and return if MP = MQ = 0

	ACF[0] = one;
	CVLI[0] = one;

	if (MA == 1) {
		return ifault;
	}

	for (i = 1; i < MA; ++i) {
		ACF[i] = zero;
	}

	if (MXPQ1 == 1) {
		return ifault;
	}

	for (i = 1; i < MXPQ1; ++i) {
		CVLI[i] = zero;
	}
	for (k = 0; k < MXPQ; ++k) {
		ALPHA[k] = 0.0;
	}

	// Computation of the A.C.F. of the moving average part stored in ACF

	if (MQ != 0) {
		for (k = 1; k <= MQ; ++k) {
			CVLI[k] = -Q[k - 1];
			ACF[k] = -Q[k - 1];
			kc = MQ - k;
			if (kc != 0) {
				for (j = 1; j <= kc; ++j) {
					jpk = j + k;
					ACF[k] += (Q[j - 1] * Q[jpk - 1]);
				}
			}//120
			ACF[0] += (Q[k - 1] * Q[k - 1]);
		}

		//Initialization of CVLI = T.W.-S.PHI -- return if MP = 0
	}//180

	if (MP == 0) {
		return ifault;
	}

	for (k = 0; k < MP; ++k) {
		ALPHA[k] = P[k];
		CVLI[k] = P[k];
	}

	// Computation of T.W.-S ALPHA and DELTA
	// DELTA stored in ACF which is gradually overwritten

	for (k = 1; k <= MXPQ; ++k) {
		kc = MXPQ - k;
		if (kc < MP) {
			div = one - ALPHA[kc] * ALPHA[kc];
			if (div <= epsil2) {
				return 5;
			}
			if (kc == 0) {
				break; //break For loop. Go to 290
			}//290
			for (j = 1; j <= kc; ++j) {
				kcp1mj = kc - j;
				ALPHA[j - 1] = (CVLI[j - 1] + ALPHA[kc] * CVLI[kcp1mj]) / div;
			}
		}//240
		if (kc < MQ) {
			j1 = imax(kc + 1 - MP, 1);
			for (j = j1; j <= kc; ++j) {
				kcp1mj = kc - j;
				ACF[j] += ACF[kc + 1] * ALPHA[kcp1mj];
			}
		}//260
		if (kc < MP) {
			for (j = 1; j <= kc; ++j) {
				CVLI[j - 1] = ALPHA[j - 1];
			}
		}
	}//290

	// Computation of T.W.-S NU
	// NU is stored in CVLI copied into ACF

	ACF[0] *= half;
	for (k = 1; k <= MXPQ; ++k) {
		if (k <= MP) {
			kp1 = k + 1;
			div = one - ALPHA[k - 1] * ALPHA[k - 1];
			for (j = 1; j <= kp1; ++j) {
				kp2mj = k + 2 - j;
				CVLI[j - 1] = (ACF[j - 1] + ALPHA[k - 1] * ACF[kp2mj - 1]) / div;
			}
			for (j = 1; j <= kp1; ++j) {
				ACF[j - 1] = CVLI[j - 1];
			}
		}//330
	}//330

	//Computation of ACF

	for (i = 1; i <= MA; ++i) {
		miim1p = imin(i - 1, MP);
		if (miim1p != 0) {
			for (j = 1; j <= miim1p; ++j) {
				imj = i - j; 
				ACF[i - 1] += P[j - 1] * ACF[imj - 1];
			}
		}//430
	}//430

	ACF[0] *= two;

	//Computation of CVLI

	CVLI[0] = one;
	if (MQ > 0) {
		for (k = 1; k <= MQ; ++k) {
			CVLI[k] = -Q[k - 1];
			if (MP != 0) {
				mikp = imin(k, MP);
				for (j = 1; j <= mikp; ++j) {
					kp1mj = k + 1 - j;
					CVLI[k] += P[j - 1] * CVLI[kp1mj - 1];
				}
			}
		}
	}

	return ifault;
}